

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_vector_fill(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_168;
  operation local_164 [2];
  operand local_15c [2];
  operation local_154 [3];
  operand local_148;
  operation local_144 [2];
  operand local_13c [2];
  operation local_134;
  operand local_130 [2];
  operation local_128 [2];
  operand local_120 [2];
  operation local_118 [2];
  undefined1 local_110 [8];
  string done;
  string repeat;
  operand local_c8;
  operand local_c4;
  operation local_c0;
  operand local_bc;
  operand local_b8;
  operation local_b4;
  long local_b0;
  operand local_a8 [2];
  operation local_a0;
  operand local_9c [2];
  operation local_94;
  unsigned_long local_90;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,psVar1,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    jump_short_if_arg_is_not_block(code,RCX,R11,(string *)local_38);
  }
  local_7c[0] = AND;
  local_84[1] = 0xb;
  local_84[0] = NUMBER;
  local_90 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_7c,local_84 + 1,local_84,&local_90);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    jump_short_if_arg_does_not_point_to_vector(code,RCX,R11,(string *)local_38);
  }
  local_94 = MOV;
  local_9c[1] = 9;
  local_9c[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_94,local_9c + 1,local_9c);
  local_a0 = MOV;
  local_a8[1] = 0x14;
  local_a8[0] = NUMBER;
  local_b0 = 0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,&local_a0,local_a8 + 1,local_a8,&local_b0);
  local_b4 = AND;
  local_b8 = RAX;
  local_bc = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&stack0xffffffffffffff4c,&stack0xffffffffffffff48,&stack0xffffffffffffff44);
  local_c0 = ADD;
  local_c4 = RCX;
  local_c8 = NUMBER;
  repeat.field_2._12_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&stack0xffffffffffffff40,&stack0xffffffffffffff3c,&stack0xffffffffffffff38,
             (int *)(repeat.field_2._M_local_buf + 0xc));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done.field_2 + 8),psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_110,psVar1,lab_01);
  local_118[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_118 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_118[0] = TEST;
  local_120[1] = 9;
  local_120[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_118,local_120 + 1,local_120);
  local_128[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_128 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  local_128[0] = MOV;
  local_130[1] = 0x1b;
  local_130[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_128,local_130 + 1,local_130);
  local_134 = ADD;
  local_13c[1] = 0xb;
  local_13c[0] = NUMBER;
  local_144[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_134,local_13c + 1,local_13c,(int *)(local_144 + 1));
  local_144[0] = DEC;
  local_148 = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_144,&local_148);
  local_154[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_154 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_154[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_154 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  local_154[0] = MOV;
  local_15c[1] = 9;
  local_15c[0] = NUMBER;
  local_164[1] = 0x4f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_154,local_15c + 1,local_15c,(int *)(local_164 + 1));
  local_164[0] = JMP;
  local_168 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_164,&local_168);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_vector_fill_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)(done.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_vector_fill(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_vector(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::RAX, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));

  auto repeat = label_to_string(label++);
  auto done = label_to_string(label++);

  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::TEST, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, asmcode::MEM_RCX, asmcode::RDX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::RAX);
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, skiwi_quiet_undefined);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_vector_fill_contract_violation);
    }
  }